

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

void curl_global_cleanup(void)

{
  if ((initialized != 0) && (initialized = initialized - 1, initialized == 0)) {
    Curl_global_host_cache_dtor();
    Curl_ssl_cleanup();
    Curl_resolver_global_cleanup();
    if ((init_flags & 2U) != 0) {
      win32_cleanup();
    }
    init_flags = 0;
  }
  return;
}

Assistant:

void curl_global_cleanup(void)
{
  if(!initialized)
    return;

  if(--initialized)
    return;

  Curl_global_host_cache_dtor();
  Curl_ssl_cleanup();
  Curl_resolver_global_cleanup();

  if(init_flags & CURL_GLOBAL_WIN32)
    win32_cleanup();

  Curl_amiga_cleanup();

#if defined(USE_LIBSSH2) && defined(HAVE_LIBSSH2_EXIT)
  (void)libssh2_exit();
#endif

#if defined(USE_LIBSSH)
  (void)ssh_finalize();
#endif

  init_flags  = 0;
}